

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::Own<kj::_::ForkHub<int>,_kj::_::ForkHubBase>::dispose
          (Own<kj::_::ForkHub<int>,_kj::_::ForkHubBase> *this)

{
  ForkHub<int> *obj;
  
  obj = this->ptr;
  if (obj != (ForkHub<int> *)0x0) {
    this->ptr = (ForkHub<int> *)0x0;
    kj::_::ForkHubBase::dispose(&obj->super_ForkHubBase);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      StaticDisposer::dispose(ptrCopy);
    }
  }